

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  unsigned_long __val;
  unsigned_long __val_00;
  string *this_00;
  string desc;
  string sStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &sStack_128;
  ::std::__cxx11::string::string((string *)&local_c8,(string *)&app->description_);
  __val = app->require_option_min_;
  __val_00 = app->require_option_max_;
  if (app->required_ == true) {
    ::std::__cxx11::string::string((string *)&local_48,"REQUIRED",(allocator *)&local_a8);
    FormatterBase::get_label(&sStack_128,&this->super_FormatterBase,&local_48);
    ::std::operator+(&local_108," ",&sStack_128);
    ::std::operator+(&local_e8,&local_108," ");
    ::std::__cxx11::string::append((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&sStack_128);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  if (__val == 0) {
    if (__val_00 == 0) goto LAB_0010b336;
    std::__cxx11::to_string(&sStack_128,__val_00);
    ::std::operator+(&local_108," \n[At most ",&sStack_128);
    ::std::operator+(&local_e8,&local_108," of the following options are allowed]");
    ::std::__cxx11::string::append((string *)&local_c8);
LAB_0010b31a:
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    if (__val_00 == __val) {
      std::__cxx11::to_string(&sStack_128,__val);
      ::std::operator+(&local_108," \n[Exactly ",&sStack_128);
      ::std::operator+(&local_e8,&local_108," of the following options are required]");
      ::std::__cxx11::string::append((string *)&local_c8);
      goto LAB_0010b31a;
    }
    if (__val_00 == 0) {
      std::__cxx11::to_string(&sStack_128,__val);
      ::std::operator+(&local_108," \n[At least ",&sStack_128);
      ::std::operator+(&local_e8,&local_108," of the following options are required]");
      ::std::__cxx11::string::append((string *)&local_c8);
      goto LAB_0010b31a;
    }
    std::__cxx11::to_string(&local_68,__val);
    ::std::operator+(&local_a8," \n[Between ",&local_68);
    ::std::operator+(&sStack_128,&local_a8," and ");
    std::__cxx11::to_string(&local_88,__val_00);
    ::std::operator+(&local_108,&sStack_128,&local_88);
    ::std::operator+(&local_e8,&local_108," of the following options are required]");
    ::std::__cxx11::string::append((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&sStack_128);
    ::std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_68;
  }
  ::std::__cxx11::string::~string((string *)this_00);
LAB_0010b336:
  if (local_c8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::operator+(__return_storage_ptr__,&local_c8,"\n\n");
  }
  ::std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();

    if(app->get_required()) {
        desc += " " + get_label("REQUIRED") + " ";
    }

    if(min_options > 0) {
        if(max_options == min_options) {
            desc += " \n[Exactly " + std::to_string(min_options) + " of the following options are required]";
        } else if(max_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the following options are required]";
        } else {
            desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
        }
    } else if(max_options > 0) {
        desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
    }

    return (!desc.empty()) ? desc + "\n\n" : std::string{};
}